

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash_dictionary_handler.c
# Opt level: O3

void oadict_init(ion_dictionary_handler_t *handler)

{
  handler->insert = oadict_insert;
  handler->create_dictionary = oadict_create_dictionary;
  handler->get = oadict_get;
  handler->update = oadict_update;
  handler->find = oadict_find;
  handler->remove = oadict_delete;
  handler->delete_dictionary = oadict_delete_dictionary;
  handler->destroy_dictionary = oadict_destroy_dictionary;
  handler->close_dictionary = oadict_close_dictionary;
  handler->open_dictionary = oadict_open_dictionary;
  return;
}

Assistant:

void
oadict_init(
	ion_dictionary_handler_t *handler
) {
	handler->insert				= oadict_insert;
	handler->create_dictionary	= oadict_create_dictionary;
	handler->get				= oadict_get;
	handler->update				= oadict_update;
	handler->find				= oadict_find;
	handler->remove				= oadict_delete;
	handler->delete_dictionary	= oadict_delete_dictionary;
	handler->destroy_dictionary = oadict_destroy_dictionary;
	handler->close_dictionary	= oadict_close_dictionary;
	handler->open_dictionary	= oadict_open_dictionary;
}